

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_digest.c
# Opt level: O1

int GostR3411_2012_256_digest_get_params(OSSL_PARAM *params)

{
  int iVar1;
  EVP_MD *d;
  
  d = GOST_init_digest(&GostR3411_2012_256_digest);
  iVar1 = digest_get_params(d,params);
  return iVar1;
}

Assistant:

static int digest_get_params(EVP_MD *d, OSSL_PARAM params[])
{
    OSSL_PARAM *p;

    if (((p = OSSL_PARAM_locate(params, "blocksize")) != NULL
         && !OSSL_PARAM_set_size_t(p, EVP_MD_block_size(d)))
        || ((p = OSSL_PARAM_locate(params, "size")) != NULL
            && !OSSL_PARAM_set_size_t(p, EVP_MD_size(d)))
        || ((p = OSSL_PARAM_locate(params, "xof")) != NULL
            && !OSSL_PARAM_set_size_t(p, EVP_MD_flags(d) & EVP_MD_FLAG_XOF)))
        return 0;
    return 1;
}